

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O0

Node verona::append_fq(Node *fq,Node *node)

{
  bool bVar1;
  element_type *peVar2;
  Token *this;
  Node *pNVar3;
  int __flags;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  void *__child_stack_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  void *__child_stack_03;
  void *__child_stack_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  void *in_R8;
  Node NVar5;
  shared_ptr<trieste::NodeDef> local_338;
  Token local_328;
  WFLookup local_320;
  shared_ptr<trieste::NodeDef> local_300;
  Node local_2f0;
  Token local_2e0;
  WFLookup local_2d8;
  shared_ptr<trieste::NodeDef> local_2b8;
  Node local_2a8;
  Node local_298;
  TokenDef local_288;
  Node local_278;
  shared_ptr<trieste::NodeDef> local_268;
  shared_ptr<trieste::NodeDef> local_258;
  Node local_248;
  TokenDef local_238;
  Node local_228;
  Token local_218;
  shared_ptr<trieste::NodeDef> local_210;
  Token local_200;
  WFLookup local_1f8;
  shared_ptr<trieste::NodeDef> local_1d8;
  Node local_1c8;
  Token local_1b8;
  Token local_1b0;
  WFLookup local_1a8;
  WFLookup local_188;
  shared_ptr<trieste::NodeDef> local_168;
  Node local_158;
  Token local_148 [3];
  Token local_130;
  WFLookup local_128;
  WFLookup local_108;
  shared_ptr<trieste::NodeDef> local_e8;
  Node local_d8;
  Node local_c8;
  Node local_b8;
  TokenDef local_a8;
  Node local_98;
  Token local_88;
  Token local_80;
  Token local_78;
  Token TStack_70;
  Token TStack_68;
  Token TStack_60;
  Token TStack_58;
  initializer_list<trieste::Token> local_50;
  Token local_40;
  Token TStack_38;
  initializer_list<trieste::Token> local_30;
  Node *node_local;
  Node *fq_local;
  
  pNVar3 = fq;
  node_local = node;
  fq_local = fq;
  peVar2 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  __flags = (int)pNVar3;
  this = trieste::NodeDef::type(peVar2);
  trieste::Token::Token(&local_40,(TokenDef *)FQType);
  trieste::Token::Token(&TStack_38,(TokenDef *)FQFunction);
  local_30._M_array = &local_40;
  local_30._M_len = 2;
  bVar1 = trieste::Token::in(this,&local_30);
  if (!bVar1) {
    __assert_fail("fq->type().in({FQType, FQFunction})",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                  ,0x1a0,"Node verona::append_fq(Node, Node)");
  }
  peVar2 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  trieste::Token::Token(&local_78,(TokenDef *)TypeClassName);
  trieste::Token::Token(&TStack_70,(TokenDef *)TypeAliasName);
  trieste::Token::Token(&TStack_68,(TokenDef *)TypeParamName);
  trieste::Token::Token(&TStack_60,(TokenDef *)TypeTraitName);
  trieste::Token::Token(&TStack_58,(TokenDef *)Selector);
  local_50._M_array = &local_78;
  local_50._M_len = 5;
  bVar1 = trieste::NodeDef::in(peVar2,&local_50);
  if (!bVar1) {
    __assert_fail("node->in( {TypeClassName, TypeAliasName, TypeParamName, TypeTraitName, Selector})"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                  ,0x1a2,"Node verona::append_fq(Node, Node)");
  }
  trieste::Token::Token(&local_80,(TokenDef *)FQFunction);
  bVar1 = trieste::operator==(node,&local_80);
  if (bVar1) {
    trieste::Token::Token(&local_88,(TokenDef *)Selector);
    bVar1 = trieste::operator!=((Node *)in_RDX,&local_88);
    if (!bVar1) {
      __assert_fail("node != Selector",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                    ,0x1a7,"Node verona::append_fq(Node, Node)");
    }
    trieste::TokenDef::operator_cast_to_shared_ptr(&local_a8);
    trieste::Token::Token(&local_130,(TokenDef *)FQType);
    trieste::operator/(&local_128,node,&local_130);
    trieste::Token::Token(local_148,(TokenDef *)TypePath);
    trieste::wf::detail::WFLookup::operator/(&local_108,&local_128,local_148);
    pNVar3 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_108);
    ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_e8,pNVar3);
    trieste::clone((trieste *)&local_d8,(__fn *)&local_e8,__child_stack,__flags,in_R8);
    trieste::Token::Token(&local_1b0,(TokenDef *)FQType);
    trieste::operator/(&local_1a8,node,&local_1b0);
    trieste::Token::Token(&local_1b8,(TokenDef *)Type);
    trieste::wf::detail::WFLookup::operator/(&local_188,&local_1a8,&local_1b8);
    pNVar3 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_188);
    ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_168,pNVar3);
    trieste::clone((trieste *)&local_158,(__fn *)&local_168,__child_stack_00,__flags,in_R8);
    trieste::operator<<((trieste *)&local_c8,&local_d8,&local_158);
    trieste::Token::Token(&local_200,(TokenDef *)Selector);
    trieste::operator/(&local_1f8,node,&local_200);
    pNVar3 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_1f8);
    ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_1d8,pNVar3);
    trieste::clone((trieste *)&local_1c8,(__fn *)&local_1d8,__child_stack_01,__flags,in_R8);
    trieste::operator<<((trieste *)&local_b8,&local_c8,&local_1c8);
    trieste::operator<<((trieste *)&local_98,(Node *)&local_a8,&local_b8);
    ::std::shared_ptr<trieste::NodeDef>::shared_ptr
              (&local_210,(shared_ptr<trieste::NodeDef> *)in_RDX);
    trieste::operator<<((trieste *)fq,&local_98,&local_210);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_210);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_98);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_b8);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_1c8);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_1d8);
    trieste::wf::detail::WFLookup::~WFLookup(&local_1f8);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_c8);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_158);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_168);
    trieste::wf::detail::WFLookup::~WFLookup(&local_188);
    trieste::wf::detail::WFLookup::~WFLookup(&local_1a8);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_d8);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_e8);
    trieste::wf::detail::WFLookup::~WFLookup(&local_108);
    trieste::wf::detail::WFLookup::~WFLookup(&local_128);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)&local_a8);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    trieste::Token::Token(&local_218,(TokenDef *)Selector);
    bVar1 = trieste::operator==((Node *)in_RDX,&local_218);
    if (bVar1) {
      trieste::TokenDef::operator_cast_to_shared_ptr(&local_238);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_258,node);
      trieste::clone((trieste *)&local_248,(__fn *)&local_258,__child_stack_02,__flags,in_R8);
      trieste::operator<<((trieste *)&local_228,(Node *)&local_238,&local_248);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                (&local_268,(shared_ptr<trieste::NodeDef> *)in_RDX);
      trieste::operator<<((trieste *)fq,&local_228,&local_268);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_268);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_228);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_248);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_258);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)&local_238);
      _Var4._M_pi = extraout_RDX_00;
    }
    else {
      trieste::TokenDef::operator_cast_to_shared_ptr(&local_288);
      trieste::Token::Token(&local_2e0,(TokenDef *)TypePath);
      trieste::operator/(&local_2d8,node,&local_2e0);
      pNVar3 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_2d8);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_2b8,pNVar3);
      trieste::clone((trieste *)&local_2a8,(__fn *)&local_2b8,__child_stack_03,__flags,in_R8);
      trieste::Token::Token(&local_328,(TokenDef *)Type);
      trieste::operator/(&local_320,node,&local_328);
      pNVar3 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_320);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_300,pNVar3);
      trieste::clone((trieste *)&local_2f0,(__fn *)&local_300,__child_stack_04,__flags,in_R8);
      trieste::operator<<((trieste *)&local_298,&local_2a8,&local_2f0);
      trieste::operator<<((trieste *)&local_278,(Node *)&local_288,&local_298);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                (&local_338,(shared_ptr<trieste::NodeDef> *)in_RDX);
      trieste::operator<<((trieste *)fq,&local_278,&local_338);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_338);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_278);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_298);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_2f0);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_300);
      trieste::wf::detail::WFLookup::~WFLookup(&local_320);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_2a8);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_2b8);
      trieste::wf::detail::WFLookup::~WFLookup(&local_2d8);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)&local_288);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)fq
  ;
  return (Node)NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node append_fq(Node fq, Node node)
  {
    assert(fq->type().in({FQType, FQFunction}));
    assert(node->in(
      {TypeClassName, TypeAliasName, TypeParamName, TypeTraitName, Selector}));

    if (fq == FQFunction)
    {
      // FQFunction + Selector = not allowed
      assert(node != Selector);

      // FQFunction + Type = FQType
      return FQType << (clone(fq / FQType / TypePath)
                        << clone(fq / FQType / Type) << clone(fq / Selector))
                    << node;
    }

    // FQType + Selector = FQFunction
    if (node == Selector)
      return FQFunction << clone(fq) << node;

    // FQType + Type = FQType
    return FQType << (clone(fq / TypePath) << clone(fq / Type)) << node;
  }